

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *window;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ImGuiContext *g;
  char cVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 0xe & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar4->ActiveId == id) {
      ClearActiveID();
    }
    return false;
  }
  bVar14 = (flags & 7U) == 0;
  uVar13 = (uint)bVar14 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar13 = (uint)bVar14 | flags;
  }
  if ((uVar13 >> 0xb & 1) == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = pIVar4->HoveredRootWindow == window;
  }
  pIVar2 = pIVar4->HoveredWindow;
  if (bVar14) {
    pIVar4->HoveredWindow = window;
  }
  bVar5 = ItemHoverable(bb,id);
  if (((bVar5) && (pIVar4->DragDropActive == true)) && ((pIVar4->DragDropPayload).SourceId == id)) {
    bVar5 = (bool)(bVar5 & ((byte)pIVar4->DragDropSourceFlags & 2) >> 1);
  }
  bVar6 = false;
  if (((uVar13 >> 9 & 1) != 0) && (pIVar4->DragDropActive != false)) {
    if ((pIVar4->DragDropSourceFlags & 4) == 0) {
      bVar6 = IsItemHovered(0x20);
      if (bVar6) {
        SetHoveredID(id);
        fVar16 = pIVar4->HoveredIdTimer + 0.0001;
        iVar8 = CalcTypematicRepeatAmount(fVar16 - (pIVar4->IO).DeltaTime,fVar16,0.7,0.0);
        if (iVar8 == 0) {
          bVar5 = true;
          bVar6 = false;
        }
        else {
          pIVar4->DragDropHoldJustPressedId = id;
          FocusWindow(window);
          bVar5 = true;
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
      }
    }
    else {
      bVar6 = false;
    }
  }
  if (bVar14) {
    pIVar4->HoveredWindow = pIVar2;
  }
  if (bVar5 == true && (uVar13 >> 0xc & 1) != 0) {
    bVar5 = (bool)(bVar5 & (pIVar4->HoveredIdPreviousFrame == 0 ||
                           pIVar4->HoveredIdPreviousFrame == id));
  }
  if (bVar5 != false) {
    if (((uVar13 >> 0x10 & 1) == 0) ||
       ((((pIVar4->IO).KeyCtrl == false && ((pIVar4->IO).KeyShift == false)) &&
        ((pIVar4->IO).KeyAlt == false)))) {
      if ((uVar13 & 1) == 0) {
LAB_001b9377:
        if (((uVar13 & 2) == 0) || ((pIVar4->IO).MouseClicked[1] == false)) {
          if ((uVar13 & 4) == 0) {
            uVar10 = 0xffffffff;
            bVar7 = 1;
          }
          else {
            bVar7 = (pIVar4->IO).MouseClicked[2] ^ 1;
            uVar10 = -(uint)bVar7 | 2;
          }
        }
        else {
          uVar10 = 1;
          bVar7 = 0;
        }
      }
      else {
        bVar7 = 0;
        uVar10 = 0;
        if ((pIVar4->IO).MouseClicked[0] == false) goto LAB_001b9377;
      }
      if (((uVar13 & 1) == 0) || ((pIVar4->IO).MouseReleased[0] == false)) {
        if (((uVar13 & 2) == 0) || ((pIVar4->IO).MouseReleased[1] == false)) {
          lVar12 = 0xffffffff;
          if ((uVar13 & 4) == 0) {
            cVar11 = '\0';
          }
          else {
            cVar11 = (pIVar4->IO).MouseReleased[2];
            if ((bool)cVar11 != false) {
              lVar12 = 2;
            }
          }
        }
        else {
          lVar12 = 1;
          cVar11 = '\x01';
        }
      }
      else {
        cVar11 = '\x01';
        lVar12 = 0;
      }
      if ((bVar7 == 0) && (pIVar4->ActiveId != id)) {
        if ((uVar13 & 0x60) != 0) {
          SetActiveID(id,window);
          pIVar4->ActiveIdMouseButton = uVar10;
          if ((uVar13 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar13 & 0x10) != 0) ||
           (((uVar13 >> 8 & 1) != 0 && ((pIVar4->IO).MouseDoubleClicked[uVar10] == true)))) {
          if ((uVar13 >> 0x11 & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          pIVar4->ActiveIdMouseButton = uVar10;
          FocusWindow(window);
          bVar6 = true;
        }
      }
      if (cVar11 == '\x01' && (char)(byte)uVar13 < '\0') {
        bVar14 = true;
        if (((uVar13 >> 10 & 1) != 0) &&
           (bVar14 = true, (pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[lVar12]
           )) {
          bVar14 = bVar6;
        }
        ClearActiveID();
        bVar6 = bVar14;
      }
      if (((((uVar13 >> 10 & 1) != 0) && (pIVar4->ActiveId == id)) &&
          (0.0 < (pIVar4->IO).MouseDownDuration[pIVar4->ActiveIdMouseButton])) &&
         (bVar14 = IsMouseClicked(pIVar4->ActiveIdMouseButton,true), bVar14)) {
        bVar6 = true;
      }
    }
    if (bVar6) {
      pIVar4->NavDisableHighlight = true;
    }
  }
  if (((pIVar4->NavId == id) && (pIVar4->NavDisableHighlight == false)) &&
     (pIVar4->NavDisableMouseHover == true)) {
    IVar1 = pIVar4->ActiveId;
    if (IVar1 == id || IVar1 == 0) {
      if ((uVar13 >> 0x13 & 1) != 0) goto LAB_001b95da;
    }
    else if (((uVar13 >> 0x13 & 1) != 0) || (IVar1 != window->MoveId)) goto LAB_001b95da;
    bVar5 = true;
  }
LAB_001b95da:
  if (pIVar4->NavActivateDownId == id) {
    bVar15 = pIVar4->NavActivateId == id;
    fVar16 = GetNavInputAmount(0,(uVar13 >> 9 & 2) + ImGuiInputReadMode_Pressed);
    bVar14 = true;
    if ((0.0 < fVar16 || bVar15) || (bVar14 = bVar6, pIVar4->ActiveId == id)) {
      bVar6 = bVar14;
      pIVar4->NavActivateId = id;
      SetActiveID(id,window);
      if ((0.0 < fVar16 || bVar15) && (uVar13 >> 0x12 & 1) == 0) {
        SetFocusID(id,window);
      }
    }
  }
  if (pIVar4->ActiveId == id) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->NavActivateDownId != id) {
        ClearActiveID();
      }
      bVar14 = false;
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        IVar3.y = (pIVar4->IO).MousePos.y - (bb->Min).y;
        IVar3.x = (pIVar4->IO).MousePos.x - (bb->Min).x;
        pIVar4->ActiveIdClickOffset = IVar3;
      }
      uVar9 = (ulong)(uint)pIVar4->ActiveIdMouseButton;
      if (4 < uVar9) {
        __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                      ,0x270,
                      "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                     );
      }
      bVar14 = true;
      if ((pIVar4->IO).MouseDown[uVar9] == false) {
        bVar14 = bVar6;
        if ((((uVar13 & 0x40) != 0) || (((byte)uVar13 >> 5 & bVar5) != 0)) &&
           (pIVar4->DragDropActive == false)) {
          if ((uVar13 >> 8 & 1) == 0) {
            cVar11 = '\0';
          }
          else {
            cVar11 = (pIVar4->IO).MouseDownWasDoubleClick[uVar9];
          }
          if ((uVar13 >> 10 & 1) == 0) {
            bVar15 = false;
          }
          else {
            bVar15 = (pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[uVar9];
          }
          if ((cVar11 == '\0') && (bVar14 = true, bVar15)) {
            bVar14 = bVar6;
          }
        }
        bVar6 = bVar14;
        ClearActiveID();
        bVar14 = false;
      }
      if ((uVar13 >> 0x12 & 1) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
    }
    else {
      bVar14 = false;
    }
    if (bVar6 != false) {
      pIVar4->ActiveIdHasBeenPressedBefore = true;
    }
  }
  else {
    bVar14 = false;
  }
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar5;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar14;
  }
  return bVar6;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            const float DRAG_DROP_HOLD_TIMER = 0.70f;
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, DRAG_DROP_HOLD_TIMER, 0.00f))
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[mouse_button_clicked]))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[mouse_button];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}